

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * Lowerer::InsertMove(Opnd *dst,Opnd *src,Instr *insertBeforeInstr,bool generateWriteBarrier)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  IRType type;
  undefined4 *puVar3;
  Instr *pIVar4;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d27,"(dst)","dst");
    if (!bVar2) goto LAB_0053e3ef;
    *puVar3 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d28,"(src)","src");
    if (!bVar2) goto LAB_0053e3ef;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3d29,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_0053e3ef:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = insertBeforeInstr->m_func;
  type = dst->m_type;
  if ((byte)(type - TyFloat32) < 2) {
    bVar2 = IR::Opnd::IsConstOpnd(src);
    if (bVar2) {
      pIVar4 = LoadFloatFromNonReg(src,dst,insertBeforeInstr);
      return pIVar4;
    }
    type = dst->m_type;
  }
  if (TySize[type] < TySize[src->m_type]) {
    src = IR::Opnd::UseWithNewType(src,type,func);
  }
  pIVar4 = IR::Instr::New(Ld_A,dst,src,func);
  IR::Instr::InsertBefore(insertBeforeInstr,pIVar4);
  if (generateWriteBarrier) {
    pIVar4 = LowererMD::ChangeToWriteBarrierAssign(pIVar4,func);
    return pIVar4;
  }
  LowererMD::ChangeToAssignNoBarrierCheck(pIVar4);
  return pIVar4;
}

Assistant:

IR::Instr *Lowerer::InsertMove(IR::Opnd *dst, IR::Opnd *src, IR::Instr *const insertBeforeInstr, bool generateWriteBarrier)
{
    Assert(dst);
    Assert(src);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    if(dst->IsFloat() && src->IsConstOpnd())
    {
        return LoadFloatFromNonReg(src, dst, insertBeforeInstr);
    }

    if(TySize[dst->GetType()] < TySize[src->GetType()])
    {
#if _M_IX86
        if (IRType_IsInt64(src->GetType()))
        {
            // On x86, if we are trying to move an int64 to a smaller type
            // Insert a move of the low bits into dst
            return InsertMove(dst, func->FindOrCreateInt64Pair(src).low, insertBeforeInstr, generateWriteBarrier);
        }
        else
#endif
        {
            src = src->UseWithNewType(dst->GetType(), func);
        }
    }
    IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dst, src, func);

    insertBeforeInstr->InsertBefore(instr);
    if (generateWriteBarrier)
    {
        instr = LowererMD::ChangeToWriteBarrierAssign(instr, func);
    }
    else
    {
        LowererMD::ChangeToAssignNoBarrierCheck(instr);
    }

    return instr;
}